

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O0

void jinit_upsampler(j_decompress_ptr cinfo)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  undefined8 uVar9;
  long *in_RDI;
  int v_out_group;
  int h_out_group;
  int v_in_group;
  int h_in_group;
  boolean do_fancy;
  boolean need_buffer;
  jpeg_component_info *compptr;
  int ci;
  my_upsample_ptr upsample;
  long local_20;
  int local_14;
  undefined8 *local_10;
  
  if (*(int *)(in_RDI[0x44] + 0x6c) == 0) {
    local_10 = (undefined8 *)(**(code **)in_RDI[1])(in_RDI,1,0x100);
    in_RDI[0x4c] = (long)local_10;
    *local_10 = start_pass_upsample;
    local_10[1] = sep_upsample;
    *(undefined4 *)(local_10 + 2) = 0;
  }
  else {
    local_10 = (undefined8 *)in_RDI[0x4c];
  }
  if ((int)in_RDI[0x31] != 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x19;
    (**(code **)*in_RDI)(in_RDI);
  }
  bVar3 = false;
  if (*(int *)((long)in_RDI + 100) != 0) {
    bVar3 = 1 < (int)in_RDI[0x34];
  }
  local_14 = 0;
  local_20 = in_RDI[0x26];
  for (; local_14 < (int)in_RDI[7]; local_14 = local_14 + 1) {
    iVar5 = (*(int *)(local_20 + 8) * *(int *)(local_20 + 0x24)) / (int)in_RDI[0x34];
    iVar6 = (*(int *)(local_20 + 0xc) * *(int *)(local_20 + 0x24)) / (int)in_RDI[0x34];
    iVar7 = (int)in_RDI[0x33];
    iVar1 = *(int *)((long)in_RDI + 0x19c);
    *(int *)((long)local_10 + (long)local_14 * 4 + 0xc0) = iVar6;
    bVar4 = true;
    if (*(int *)(local_20 + 0x30) == 0) {
      local_10[(long)local_14 + 0xd] = noop_upsample;
      bVar4 = false;
    }
    else if ((iVar5 == iVar7) && (iVar6 == iVar1)) {
      local_10[(long)local_14 + 0xd] = fullsize_upsample;
      bVar4 = false;
    }
    else if ((iVar5 << 1 == iVar7) && (iVar6 == iVar1)) {
      if ((bVar3) && (2 < *(uint *)(local_20 + 0x28))) {
        iVar7 = jsimd_can_h2v1_fancy_upsample();
        if (iVar7 == 0) {
          local_10[(long)local_14 + 0xd] = h2v1_fancy_upsample;
        }
        else {
          local_10[(long)local_14 + 0xd] = jsimd_h2v1_fancy_upsample;
        }
      }
      else {
        iVar7 = jsimd_can_h2v1_upsample();
        if (iVar7 == 0) {
          local_10[(long)local_14 + 0xd] = h2v1_upsample;
        }
        else {
          local_10[(long)local_14 + 0xd] = jsimd_h2v1_upsample;
        }
      }
    }
    else if (((iVar5 == iVar7) && (iVar6 << 1 == iVar1)) && (bVar3)) {
      local_10[(long)local_14 + 0xd] = h1v2_fancy_upsample;
      *(undefined4 *)(local_10 + 2) = 1;
    }
    else if ((iVar5 << 1 == iVar7) && (iVar6 << 1 == iVar1)) {
      if ((bVar3) && (2 < *(uint *)(local_20 + 0x28))) {
        iVar7 = jsimd_can_h2v2_fancy_upsample();
        if (iVar7 == 0) {
          local_10[(long)local_14 + 0xd] = h2v2_fancy_upsample;
        }
        else {
          local_10[(long)local_14 + 0xd] = jsimd_h2v2_fancy_upsample;
        }
        *(undefined4 *)(local_10 + 2) = 1;
      }
      else {
        iVar7 = jsimd_can_h2v2_upsample();
        if (iVar7 == 0) {
          local_10[(long)local_14 + 0xd] = h2v2_upsample;
        }
        else {
          local_10[(long)local_14 + 0xd] = jsimd_h2v2_upsample;
        }
      }
    }
    else if ((iVar7 % iVar5 == 0) && (iVar1 % iVar6 == 0)) {
      local_10[(long)local_14 + 0xd] = int_upsample;
      *(char *)((long)local_10 + (long)local_14 + 0xe8) = (char)(iVar7 / iVar5);
      *(char *)((long)local_10 + (long)local_14 + 0xf2) = (char)(iVar1 / iVar6);
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x26;
      (**(code **)*in_RDI)(in_RDI);
    }
    if ((bVar4) && (*(int *)(in_RDI[0x44] + 0x6c) == 0)) {
      pcVar2 = *(code **)(in_RDI[1] + 0x10);
      uVar8 = jround_up((ulong)*(uint *)(in_RDI + 0x11),(long)(int)in_RDI[0x33]);
      uVar9 = (*pcVar2)(in_RDI,1,uVar8 & 0xffffffff,*(undefined4 *)((long)in_RDI + 0x19c));
      local_10[(long)local_14 + 3] = uVar9;
    }
    local_20 = local_20 + 0x60;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_upsampler(j_decompress_ptr cinfo)
{
  my_upsample_ptr upsample;
  int ci;
  jpeg_component_info *compptr;
  boolean need_buffer, do_fancy;
  int h_in_group, v_in_group, h_out_group, v_out_group;

  if (!cinfo->master->jinit_upsampler_no_alloc) {
    upsample = (my_upsample_ptr)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  sizeof(my_upsampler));
    cinfo->upsample = (struct jpeg_upsampler *)upsample;
    upsample->pub.start_pass = start_pass_upsample;
    upsample->pub.upsample = sep_upsample;
    upsample->pub.need_context_rows = FALSE; /* until we find out differently */
  } else
    upsample = (my_upsample_ptr)cinfo->upsample;

  if (cinfo->CCIR601_sampling)  /* this isn't supported */
    ERREXIT(cinfo, JERR_CCIR601_NOTIMPL);

  /* jdmainct.c doesn't support context rows when min_DCT_scaled_size = 1,
   * so don't ask for it.
   */
  do_fancy = cinfo->do_fancy_upsampling && cinfo->_min_DCT_scaled_size > 1;

  /* Verify we can handle the sampling factors, select per-component methods,
   * and create storage as needed.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Compute size of an "input group" after IDCT scaling.  This many samples
     * are to be converted to max_h_samp_factor * max_v_samp_factor pixels.
     */
    h_in_group = (compptr->h_samp_factor * compptr->_DCT_scaled_size) /
                 cinfo->_min_DCT_scaled_size;
    v_in_group = (compptr->v_samp_factor * compptr->_DCT_scaled_size) /
                 cinfo->_min_DCT_scaled_size;
    h_out_group = cinfo->max_h_samp_factor;
    v_out_group = cinfo->max_v_samp_factor;
    upsample->rowgroup_height[ci] = v_in_group; /* save for use later */
    need_buffer = TRUE;
    if (!compptr->component_needed) {
      /* Don't bother to upsample an uninteresting component. */
      upsample->methods[ci] = noop_upsample;
      need_buffer = FALSE;
    } else if (h_in_group == h_out_group && v_in_group == v_out_group) {
      /* Fullsize components can be processed without any work. */
      upsample->methods[ci] = fullsize_upsample;
      need_buffer = FALSE;
    } else if (h_in_group * 2 == h_out_group && v_in_group == v_out_group) {
      /* Special cases for 2h1v upsampling */
      if (do_fancy && compptr->downsampled_width > 2) {
        if (jsimd_can_h2v1_fancy_upsample())
          upsample->methods[ci] = jsimd_h2v1_fancy_upsample;
        else
          upsample->methods[ci] = h2v1_fancy_upsample;
      } else {
        if (jsimd_can_h2v1_upsample())
          upsample->methods[ci] = jsimd_h2v1_upsample;
        else
          upsample->methods[ci] = h2v1_upsample;
      }
    } else if (h_in_group == h_out_group &&
               v_in_group * 2 == v_out_group && do_fancy) {
      /* Non-fancy upsampling is handled by the generic method */
#if defined(__arm__) || defined(__aarch64__) || \
    defined(_M_ARM) || defined(_M_ARM64)
      if (jsimd_can_h1v2_fancy_upsample())
        upsample->methods[ci] = jsimd_h1v2_fancy_upsample;
      else
#endif
        upsample->methods[ci] = h1v2_fancy_upsample;
      upsample->pub.need_context_rows = TRUE;
    } else if (h_in_group * 2 == h_out_group &&
               v_in_group * 2 == v_out_group) {
      /* Special cases for 2h2v upsampling */
      if (do_fancy && compptr->downsampled_width > 2) {
        if (jsimd_can_h2v2_fancy_upsample())
          upsample->methods[ci] = jsimd_h2v2_fancy_upsample;
        else
          upsample->methods[ci] = h2v2_fancy_upsample;
        upsample->pub.need_context_rows = TRUE;
      } else {
        if (jsimd_can_h2v2_upsample())
          upsample->methods[ci] = jsimd_h2v2_upsample;
        else
          upsample->methods[ci] = h2v2_upsample;
      }
    } else if ((h_out_group % h_in_group) == 0 &&
               (v_out_group % v_in_group) == 0) {
      /* Generic integral-factors upsampling method */
#if defined(__mips__)
      if (jsimd_can_int_upsample())
        upsample->methods[ci] = jsimd_int_upsample;
      else
#endif
        upsample->methods[ci] = int_upsample;
      upsample->h_expand[ci] = (UINT8)(h_out_group / h_in_group);
      upsample->v_expand[ci] = (UINT8)(v_out_group / v_in_group);
    } else
      ERREXIT(cinfo, JERR_FRACT_SAMPLE_NOTIMPL);
    if (need_buffer && !cinfo->master->jinit_upsampler_no_alloc) {
      upsample->color_buf[ci] = (*cinfo->mem->alloc_sarray)
        ((j_common_ptr)cinfo, JPOOL_IMAGE,
         (JDIMENSION)jround_up((long)cinfo->output_width,
                               (long)cinfo->max_h_samp_factor),
         (JDIMENSION)cinfo->max_v_samp_factor);
    }
  }
}